

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  char *pcVar8;
  int64_t iVar9;
  long lVar10;
  long llOffset;
  long llBaseOffset;
  int64_t unaff_R12;
  int iVar11;
  pair<long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar12;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar13;
  long lStack_120;
  int local_114;
  int local_110;
  long local_108;
  long local_100;
  string crcspec;
  string srcFilename;
  long local_b8;
  string dstFilename;
  ArgParser local_90;
  ArgIterator __begin1;
  ArgIterator __end1;
  
  srcFilename._M_dataplus._M_p = (pointer)&srcFilename.field_2;
  srcFilename._M_string_length = 0;
  dstFilename._M_dataplus._M_p = (pointer)&dstFilename.field_2;
  dstFilename._M_string_length = 0;
  srcFilename.field_2._M_local_buf[0] = '\0';
  dstFilename.field_2._M_local_buf[0] = '\0';
  crcspec._M_dataplus._M_p = (pointer)&crcspec.field_2;
  crcspec._M_string_length = 0;
  crcspec.field_2._M_local_buf[0] = '\0';
  local_90.argc = argc;
  local_90.argv = argv;
  ArgParser::begin(&__begin1,&local_90);
  ArgParser::end(&__end1,&local_90);
  iVar6 = 1;
  local_110 = 0;
  bVar2 = false;
  bVar3 = false;
  local_114 = 0;
  iVar11 = 0;
  while ((__begin1.i != __end1.i || (__begin1.p != __end1.p))) {
    iVar5 = ArgParser::ArgIterator::option(&__begin1);
    switch(iVar5) {
    case 0x61:
      g_dumpformat = DUMP_STRINGS;
      break;
    case 0x62:
      unaff_R12 = ArgParser::ArgIterator::getint(&__begin1);
      local_110 = 1;
      break;
    case 99:
      bVar4 = ArgParser::ArgIterator::match(&__begin1,"-crc");
      if (bVar4) {
        g_dumpformat = DUMP_CRC32;
        pcVar8 = ArgParser::ArgIterator::getstr(&__begin1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&crcspec,pcVar8);
      }
      else {
        g_dumpformat = DUMP_RAW;
      }
      break;
    case 100:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x74:
    case 0x75:
    case 0x76:
      goto switchD_00105de8_caseD_64;
    case 0x65:
      local_108 = ArgParser::ArgIterator::getint(&__begin1);
      bVar3 = true;
      break;
    case 0x66:
      g_fulldump = true;
      break;
    case 0x68:
      g_dumpformat = DUMP_HASHES;
      break;
    case 0x6c:
      local_100 = ArgParser::ArgIterator::getint(&__begin1);
      bVar2 = true;
      break;
    case 0x6d:
      bVar4 = ArgParser::ArgIterator::match(&__begin1,"-md5");
      if (bVar4) {
        g_dumpformat = DUMP_HASH;
        g_hashtype = 1;
      }
      else {
        bVar4 = ArgParser::ArgIterator::match(&__begin1,"-md4");
        if (bVar4) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 0;
        }
        else {
          bVar4 = ArgParser::ArgIterator::match(&__begin1,"-md160");
          if (bVar4) goto LAB_00105fcb;
        }
      }
      break;
    case 0x6f:
      local_b8 = ArgParser::ArgIterator::getint(&__begin1);
      local_114 = 1;
      break;
    case 0x72:
      bVar4 = ArgParser::ArgIterator::match(&__begin1,"-ripemd160");
      if (bVar4) {
LAB_00105fcb:
        g_dumpformat = DUMP_HASH;
        g_hashtype = 6;
      }
      else {
        uVar7 = ArgParser::ArgIterator::getuint(&__begin1);
        g_chunksize = (uint32_t)uVar7;
      }
      break;
    case 0x73:
      bVar4 = ArgParser::ArgIterator::match(&__begin1,"-sha256");
      if (bVar4) {
        g_dumpformat = DUMP_HASH;
        g_hashtype = 3;
      }
      else {
        bVar4 = ArgParser::ArgIterator::match(&__begin1,"-sha384");
        if (bVar4) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 4;
        }
        else {
          bVar4 = ArgParser::ArgIterator::match(&__begin1,"-sha512");
          if (bVar4) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = g_dumpformat;
          }
          else {
            bVar4 = ArgParser::ArgIterator::match(&__begin1,"-sum");
            if (bVar4) {
              g_dumpformat = DUMP_SUM;
            }
            else {
              g_llStepSize = ArgParser::ArgIterator::getint(&__begin1);
            }
          }
        }
      }
      break;
    case 0x77:
      iVar9 = ArgParser::ArgIterator::getint(&__begin1);
      g_nMaxUnitsPerLine = (int)iVar9;
      break;
    case 0x78:
      iVar5 = ArgParser::ArgIterator::count(&__begin1);
      if (iVar5 == 2) {
        g_dumpformat = DUMP_ASCII;
      }
      else {
        g_dumpformat = DUMP_HEX;
      }
      break;
    default:
      uVar1 = iVar5 - 0x31;
      if (uVar1 < 0x23) {
        if ((0x8bUL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          if ((ulong)uVar1 != 0x22) goto LAB_00105e32;
          uVar7 = ArgParser::ArgIterator::getuint(&__begin1);
          g_summarizeThreshold = (int)uVar7;
        }
        else {
          iVar6 = ArgParser::ArgIterator::option(&__begin1);
          iVar6 = iVar6 + -0x30;
        }
      }
      else {
LAB_00105e32:
        if (1 < iVar5 + 1U) goto switchD_00105de8_caseD_64;
        if (iVar11 == 1) {
          pcVar8 = ArgParser::ArgIterator::getstr(&__begin1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&dstFilename,pcVar8);
          iVar11 = 2;
        }
        else if (iVar11 == 0) {
          pcVar8 = ArgParser::ArgIterator::getstr(&__begin1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&srcFilename,pcVar8);
          iVar11 = 1;
        }
        else {
          iVar11 = iVar11 + 1;
        }
      }
    }
    ArgParser::ArgIterator::operator++(&__begin1);
  }
  if (iVar11 != 0 && iVar11 < 3) {
    if (crcspec._M_string_length != 0) {
      pVar12 = parsesigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )crcspec._M_dataplus._M_p,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(crcspec._M_dataplus._M_p + crcspec._M_string_length),0);
      g_crc_initval = pVar12.first;
      if (pVar12.second._M_current._M_current != crcspec._M_dataplus._M_p + crcspec._M_string_length
         ) {
        pVar13 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(pVar12.second._M_current._M_current + 1),
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(crcspec._M_dataplus._M_p + crcspec._M_string_length),0);
        g_crc_poly = pVar13.first;
        if (pVar13.second._M_current._M_current !=
            crcspec._M_dataplus._M_p + crcspec._M_string_length) {
          pVar13 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(pVar13.second._M_current._M_current + 1),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(crcspec._M_dataplus._M_p + crcspec._M_string_length),0);
          g_crc_bits = pVar13.first;
        }
      }
    }
    if (g_nMaxUnitsPerLine < 0) {
      if (g_dumpformat == DUMP_HEX) {
        lStack_120 = 0x20;
      }
      else if (g_dumpformat == DUMP_ASCII) {
        lStack_120 = 0x40;
      }
      else {
        if (4 < (int)g_dumpformat) {
          g_nMaxUnitsPerLine = (int)g_llStepSize;
          goto LAB_001061b2;
        }
        lStack_120 = 0x10;
      }
      g_nMaxUnitsPerLine = (int)(lStack_120 / (long)iVar6);
    }
LAB_001061b2:
    if (iVar6 == 1) {
      g_dumpunit = DUMPUNIT_BYTE;
    }
    else if (iVar6 == 2) {
      g_dumpunit = DUMPUNIT_WORD;
    }
    else if (iVar6 == 4) {
      g_dumpunit = DUMPUNIT_DWORD;
    }
    else {
      g_dumpunit = (uint)(iVar6 == 8) * 3;
    }
    bVar4 = std::operator==(&srcFilename,"-");
    if (bVar4) {
      lVar10 = -1;
    }
    else {
      lVar10 = GetFileSize(&srcFilename);
    }
    llBaseOffset = 0;
    if (local_110 != 0) {
      llBaseOffset = unaff_R12;
    }
    iVar6 = 1;
    if (local_110 == 0) {
      local_110 = iVar6;
    }
    llOffset = llBaseOffset;
    iVar11 = local_110;
    if ((local_114 != 0) && (llOffset = local_b8, iVar11 = local_114, local_b8 < 0)) {
      if ((~bVar4 & -1 < lVar10) != 0) {
        if (local_110 == 0) {
          std::__throw_bad_optional_access();
        }
        llOffset = local_b8 + llBaseOffset + lVar10;
        iVar11 = 1;
        goto LAB_00106273;
      }
      pcVar8 = "dumping end of stdin stream not yet implemented";
      goto LAB_0010635a;
    }
LAB_00106273:
    if (bVar2) {
      if (bVar3) {
        if (iVar11 == 0) {
          std::__throw_bad_optional_access();
        }
        if (local_108 == llOffset + local_100) goto LAB_00106344;
        pcVar8 = "inconsistent use of -l, -o and -e";
      }
      else {
        if (-1 < local_100) {
          if (iVar11 == 0) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00106344;
        }
        pcVar8 = "Can\'t use negative length";
      }
    }
    else {
      if (bVar3) {
        if (local_108 < 0) {
          if ((~bVar4 & -1 < lVar10) == 0) {
            pcVar8 = "Can\'t use negative offsets, on stdin";
            goto LAB_0010635a;
          }
          local_108 = local_108 + lVar10;
        }
        if (iVar11 == 0) {
          std::__throw_bad_optional_access();
        }
        local_100 = local_108 - llOffset;
      }
      else {
        if (-1 < lVar10) {
          if (local_110 == 0) {
            std::__throw_bad_optional_access();
          }
          if (iVar11 == 0) {
            std::__throw_bad_optional_access();
          }
          local_100 = (lVar10 + llBaseOffset) - llOffset;
          bVar2 = true;
          goto LAB_00106344;
        }
        if (iVar11 == 0) goto LAB_00106417;
        local_100 = 0x7fffffffffffffff;
      }
      bVar2 = true;
LAB_00106344:
      if (local_110 == 0) goto LAB_00106417;
      if (llBaseOffset <= llOffset) {
        if (dstFilename._M_string_length == 0) {
          if (g_llStepSize == 0) {
            if (!bVar2) goto LAB_00106417;
            Dumpfile(&srcFilename,llBaseOffset,llOffset,local_100);
          }
          else {
            if (!bVar2) goto LAB_00106417;
            StepFile(&srcFilename,llBaseOffset,llOffset,local_100);
          }
        }
        else if (g_llStepSize == 0) {
          if (!bVar2) goto LAB_00106417;
          Copyfile(&srcFilename,&dstFilename,llBaseOffset,llOffset,local_100);
        }
        else {
          if (!bVar2) {
LAB_00106417:
            std::__throw_bad_optional_access();
          }
          CopyFileSteps(&srcFilename,&dstFilename,llBaseOffset,llOffset,local_100);
        }
        iVar6 = 0;
        goto LAB_001063e5;
      }
      pcVar8 = "offset must be >= baseoffset";
    }
LAB_0010635a:
    puts(pcVar8);
    goto LAB_001063e5;
  }
switchD_00105de8_caseD_64:
  usage();
  iVar6 = 1;
LAB_001063e5:
  std::__cxx11::string::~string((string *)&crcspec);
  std::__cxx11::string::~string((string *)&dstFilename);
  std::__cxx11::string::~string((string *)&srcFilename);
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    std::optional<int64_t> llOffset;
    std::optional<int64_t> llEndOffset;
    std::optional<int64_t> llLength;
    std::optional<int64_t> llBaseOffset;

    std::string srcFilename;
    std::string dstFilename;
    int nDumpUnitSize = 1;
    std::string crcspec;

    int argsfound = 0; 

    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
            case 'b': llBaseOffset = arg.getint(); break;
            case 'o': llOffset = arg.getint(); break;
            case 'e': llEndOffset = arg.getint(); break;
            case 'l': llLength = arg.getint(); break;

            case 'h': g_dumpformat= DUMP_HASHES; break;
            case 'r': 
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      if (arg.match("-ripemd160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
                      else
#endif
#endif
 
                      g_chunksize = arg.getuint(); break;

            case 'w': g_nMaxUnitsPerLine = arg.getint(); break;
            case 's': if (0)
                          ;
#ifdef SHA1_DIGEST_LENGTH
                      else if (arg.match("-sha1")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA1;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef SHA256_DIGEST_LENGTH
                      else if (arg.match("-sha256")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA256;
                      }
#endif
#ifdef SHA384_DIGEST_LENGTH
                      else if (arg.match("-sha384")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA384;
                      }
#endif
#ifdef SHA512_DIGEST_LENGTH
                      else if (arg.match("-sha512")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA512;
                      }
#endif
#endif

                      else if (arg.match("-sum"))
                          g_dumpformat= DUMP_SUM;
                      else
                          g_llStepSize = arg.getint();
                      break;
            case 'm': if (0)
                          ;
#ifdef MD5_DIGEST_LENGTH
                      else if (arg.match("-md5")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD5;
                      }
#endif
#ifdef MD2_DIGEST_LENGTH
                      else if (arg.match("-md2")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD2;
                      }
#endif
#ifdef MD4_DIGEST_LENGTH
                      else if (arg.match("-md4")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD4;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      else if (arg.match("-md160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
#endif
#endif

                      break;
            case 'a': g_dumpformat= DUMP_STRINGS; break;
            case 'c': if (arg.match("-crc")) {
                          g_dumpformat= DUMP_CRC32; 
                          crcspec = arg.getstr();
                      }
                      else
                          g_dumpformat= DUMP_RAW; 
                      break;
            case 'f': g_fulldump= true; break;
            case 'S': g_summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          g_dumpformat= DUMP_ASCII; 
                      else
                          g_dumpformat= DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                nDumpUnitSize= arg.option()-'0';
                break;
            case 0: // single '-'
            case -1:
                switch (argsfound++) {
                    case 0: srcFilename= arg.getstr(); break;
                    case 1: dstFilename= arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }
    if (argsfound==0 || argsfound>2)
    {
        usage();
        return 1;
    }

    if (!crcspec.empty()) {
        auto res1 = parsesigned(crcspec.begin(), crcspec.end(), 0);
        g_crc_initval= res1.first;
        if (res1.second!=crcspec.end()) {
            auto res2 = parseunsigned(res1.second+1, crcspec.end(), 0);
            g_crc_poly= res2.first;
            if (res2.second!=crcspec.end()) {
                auto res3 = parseunsigned(res2.second+1, crcspec.end(), 0);
                g_crc_bits= res3.first;

            }
        }
    }

    // 64 = highest 2^n, such that addrsize + 2^n <= screenwidth
    // 32 = highest 2^n, such that addrsize + 3*2^n <= screenwidth+25 ...
    // 16 = highest 2^n, such that addrsize + 4*2^n <= screenwidth
    if (g_nMaxUnitsPerLine<0) {
        if (g_dumpformat==DUMP_ASCII) 
            g_nMaxUnitsPerLine= 64/nDumpUnitSize;
        else if (g_dumpformat==DUMP_HEX) 
            g_nMaxUnitsPerLine= 32/nDumpUnitSize;
        else if (g_dumpformat>=DUMP_HASH)
            g_nMaxUnitsPerLine= g_llStepSize;
        else
            g_nMaxUnitsPerLine= 16/nDumpUnitSize;
    }

    g_dumpunit= 
        nDumpUnitSize==1?DUMPUNIT_BYTE:
        nDumpUnitSize==2?DUMPUNIT_WORD:
        nDumpUnitSize==4?DUMPUNIT_DWORD:
        nDumpUnitSize==8?DUMPUNIT_QWORD:DUMPUNIT_BYTE;

    if (g_dumpformat==DUMP_RAW) {
#ifdef WIN32
        if (-1==_setmode( _fileno( stdout ), _O_BINARY )) {
            print("ERROR: _setmode(stdout, rb)");
            return 1;
        }
#endif
    }

    bool fromStdin= srcFilename=="-";

    int64_t llFileSize= fromStdin ? -1 : GetFileSize(srcFilename);

    if (!llBaseOffset)
        llBaseOffset = 0;

    // determine start
    if (!llOffset)
        llOffset = llBaseOffset;
    else if (llOffset.value() < 0) {
        if (fromStdin || llFileSize < 0) {
            printf("dumping end of stdin stream not yet implemented\n");
            return 1;
        }
        llOffset = llBaseOffset.value() + llOffset.value() + llFileSize;
    }

    // determine end
    if (!llLength && !llEndOffset)
    {
        if (llFileSize >= 0) {
            llEndOffset = llBaseOffset.value() + llFileSize;
            llLength = llEndOffset.value() - llOffset.value();
        }
        // else: filesize, length unknown - until EOF.
        else {
            llEndOffset = INT64_MAX;
            llLength = INT64_MAX;
        }
    }
    else if (!llLength && llEndOffset) {
        if (llEndOffset < 0) {
            if (fromStdin || llFileSize < 0) {
                printf("Can't use negative offsets, on stdin\n");
                return 1;
            }
            llEndOffset = llEndOffset.value() + llFileSize;
        }
        llLength = llEndOffset.value() - llOffset.value();
    }
    else if (llLength && !llEndOffset) {
        if (llLength < 0) {
            printf("Can't use negative length\n");
            return 1;
        }
        llEndOffset = llOffset.value() + llLength.value();
    }
    else {
        if (llEndOffset != llOffset.value() + llLength.value()) {
            printf("inconsistent use of -l, -o and -e\n");
            return 1;
        }
    }

    if (llOffset.value() < llBaseOffset.value()) {
        printf("offset must be >= baseoffset\n");
        return 1;
    }


    if (!dstFilename.empty()) {
        if (g_llStepSize)
            CopyFileSteps(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Copyfile(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }
    else {
        if (g_llStepSize)
            StepFile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Dumpfile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }

    return 0;
}